

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void __thiscall
duckdb::RLEState<unsigned_int>::Update<duckdb::RLECompressState<unsigned_int,true>::RLEWriter>
          (RLEState<unsigned_int> *this,uint *data,ValidityMask *validity,idx_t idx)

{
  unsigned_long *puVar1;
  rle_count_t rVar2;
  uint uVar3;
  
  puVar1 = (validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[idx >> 6] >> (idx & 0x3f) & 1) != 0)) {
    if (this->all_null == true) {
      this->last_value = data[idx];
      this->seen_count = this->seen_count + 1;
      rVar2 = (short)*(undefined4 *)&this->last_seen_count + 1;
      this->last_seen_count = rVar2;
      this->all_null = false;
      goto LAB_0170fc67;
    }
    uVar3 = data[idx];
    rVar2 = this->last_seen_count;
    if (this->last_value != uVar3) {
      if (rVar2 != 0) {
        RLECompressState<unsigned_int,_true>::WriteValue
                  ((RLECompressState<unsigned_int,_true> *)this->dataptr,this->last_value,rVar2,
                   false);
        this->seen_count = this->seen_count + 1;
        uVar3 = data[idx];
      }
      this->last_value = uVar3;
      this->last_seen_count = 1;
      return;
    }
  }
  else {
    rVar2 = (rle_count_t)*(undefined4 *)&this->last_seen_count;
  }
  rVar2 = rVar2 + 1;
  this->last_seen_count = rVar2;
LAB_0170fc67:
  if (rVar2 == 0xffff) {
    RLECompressState<unsigned_int,_true>::WriteValue
              ((RLECompressState<unsigned_int,_true> *)this->dataptr,this->last_value,0xffff,
               this->all_null);
    this->last_seen_count = 0;
    this->seen_count = this->seen_count + 1;
  }
  return;
}

Assistant:

void Update(const T *data, ValidityMask &validity, idx_t idx) {
		if (validity.RowIsValid(idx)) {
			if (all_null) {
				// no value seen yet
				// assign the current value, and increment the seen_count
				// note that we increment last_seen_count rather than setting it to 1
				// this is intentional: this is the first VALID value we see
				// but it might not be the first value in case of nulls!
				last_value = data[idx];
				seen_count++;
				last_seen_count++;
				all_null = false;
			} else if (last_value == data[idx]) {
				// the last value is identical to this value: increment the last_seen_count
				last_seen_count++;
			} else {
				// the values are different
				// issue the callback on the last value
				// edge case: if a value has exactly 2^16 repeated values, we can end up here with last_seen_count = 0
				if (last_seen_count > 0) {
					Flush<OP>();
					seen_count++;
				}

				// increment the seen_count and put the new value into the RLE slot
				last_value = data[idx];
				last_seen_count = 1;
			}
		} else {
			// NULL value: we merely increment the last_seen_count
			last_seen_count++;
		}
		if (last_seen_count == NumericLimits<rle_count_t>::Maximum()) {
			// we have seen the same value so many times in a row we are at the limit of what fits in our count
			// write away the value and move to the next value
			Flush<OP>();
			last_seen_count = 0;
			seen_count++;
		}
	}